

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
          (timestamp_t input)

{
  bool bVar1;
  timestamp_t tVar2;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    tVar2 = DayOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}